

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall
icu_63::PluralFormat::setNumberFormat(PluralFormat *this,NumberFormat *format,UErrorCode *status)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  iVar1 = (*(format->super_Format).super_UObject._vptr_UObject[4])(format);
  if ((NumberFormat *)CONCAT44(extraout_var,iVar1) == (NumberFormat *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    if (this->numberFormat != (NumberFormat *)0x0) {
      (*(this->numberFormat->super_Format).super_UObject._vptr_UObject[1])();
    }
    this->numberFormat = (NumberFormat *)CONCAT44(extraout_var,iVar1);
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }